

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O3

bool __thiscall xmrig::Url::parse(Url *this,char *url)

{
  ulong __n;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *str;
  long lVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Scheme SVar5;
  EVP_PKEY_CTX *dst;
  
  if (url == (char *)0x0) {
    bVar1 = false;
  }
  else {
    pcVar3 = strstr(url,"://");
    src = extraout_RDX;
    dst = (EVP_PKEY_CTX *)url;
    if (pcVar3 != (char *)0x0) {
      iVar2 = strncasecmp(url,"stratum+tcp://",0xe);
      SVar5 = STRATUM;
      if (iVar2 == 0) {
        bVar1 = false;
        src = extraout_RDX_00;
      }
      else {
        iVar2 = strncasecmp(url,"stratum+ssl://",0xe);
        bVar1 = true;
        src = extraout_RDX_01;
        if (iVar2 != 0) {
          iVar2 = strncasecmp(url,"daemon+https://",0xf);
          SVar5 = DAEMON;
          src = extraout_RDX_02;
          if (iVar2 != 0) {
            iVar2 = strncasecmp(url,"daemon+http://",0xe);
            bVar1 = false;
            src = extraout_RDX_03;
            if (iVar2 != 0) {
              return false;
            }
          }
        }
      }
      this->m_scheme = SVar5;
      this->m_tls = bVar1;
      dst = (EVP_PKEY_CTX *)(pcVar3 + 3);
    }
    bVar1 = false;
    if ((*dst != (EVP_PKEY_CTX)0x0) && (bVar1 = false, *dst != (EVP_PKEY_CTX)0x2f)) {
      String::copy(&this->m_url,(EVP_PKEY_CTX *)url,src);
      if (*dst == (EVP_PKEY_CTX)0x5b) {
        bVar1 = parseIPv6(this,(char *)dst);
        return bVar1;
      }
      pcVar3 = strchr((char *)dst,0x3a);
      if (pcVar3 == (char *)0x0) {
        String::copy(&this->m_host,dst,src_00);
      }
      else {
        __n = ((long)pcVar3 - (long)dst) + 1;
        str = (char *)operator_new__(__n);
        memset(str,0,__n);
        memcpy(str,dst,(long)pcVar3 - (long)dst);
        String::move(&this->m_host,str);
        lVar4 = strtol(pcVar3 + 1,(char **)0x0,10);
        this->m_port = (uint16_t)lVar4;
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool xmrig::Url::parse(const char *url)
{
    if (url == nullptr) {
        return false;
    }

    const char *p    = strstr(url, "://");
    const char *base = url;

    if (p) {
        if (strncasecmp(url, kStratumTcp, sizeof(kStratumTcp) - 1) == 0) {
            m_scheme = STRATUM;
            m_tls    = false;
        }
        else if (strncasecmp(url, kStratumSsl, sizeof(kStratumSsl) - 1) == 0) {
            m_scheme = STRATUM;
            m_tls    = true;
        }
#       ifdef XMRIG_FEATURE_HTTP
        else if (strncasecmp(url, kDaemonHttps, sizeof(kDaemonHttps) - 1) == 0) {
            m_scheme = DAEMON;
            m_tls    = true;
        }
        else if (strncasecmp(url, kDaemonHttp, sizeof(kDaemonHttp) - 1) == 0) {
            m_scheme = DAEMON;
            m_tls    = false;
        }
#       endif
        else {
            return false;
        }

        base = p + 3;
    }

    if (!strlen(base) || *base == '/') {
        return false;
    }

    m_url = url;
    if (base[0] == '[') {
        return parseIPv6(base);
    }

    const char *port = strchr(base, ':');
    if (!port) {
        m_host = base;
        return true;
    }

    const auto size = static_cast<size_t>(port++ - base + 1);
    char *host      = new char[size]();
    memcpy(host, base, size - 1);

    m_host = host;
    m_port = static_cast<uint16_t>(strtol(port, nullptr, 10));

    return true;
}